

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# autoarimatest2.c
# Opt level: O0

int main(void)

{
  int N_00;
  int iVar1;
  double *xpred_00;
  double *amse_00;
  double *inp_00;
  auto_arima_object obj_00;
  double dVar2;
  double temp [1200];
  FILE *ifp;
  int seasonal [3];
  int order [3];
  auto_arima_object obj;
  double *amse;
  double *xpred;
  int r;
  int s;
  int Q;
  int P;
  int q;
  int p;
  double *inp;
  int L;
  int D;
  int d;
  int N;
  int i;
  
  seasonal[1] = 5;
  seasonal[2] = 2;
  ifp._0_4_ = 2;
  ifp._4_4_ = 1;
  seasonal[0] = 2;
  xpred_00 = (double *)malloc(0);
  amse_00 = (double *)malloc(0);
  temp[0x4af] = (double)fopen("../data/seriesG.txt","r");
  d = 0;
  if ((FILE *)temp[0x4af] != (FILE *)0x0) {
    while (N_00 = d, iVar1 = feof((FILE *)temp[0x4af]), iVar1 == 0) {
      __isoc99_fscanf(temp[0x4af],"%lf\n",temp + (long)d + -1);
      d = d + 1;
    }
    inp_00 = (double *)malloc((long)d << 3);
    for (d = 0; d < N_00; d = d + 1) {
      dVar2 = log(temp[(long)d + -1]);
      inp_00[d] = dVar2;
    }
    obj_00 = auto_arima_init(seasonal + 1,(int *)&ifp,0xc,0,N_00);
    auto_arima_setApproximation(obj_00,1);
    auto_arima_setStepwise(obj_00,1);
    auto_arima_setVerbose(obj_00,1);
    auto_arima_exec(obj_00,inp_00,(double *)0x0);
    auto_arima_summary(obj_00);
    auto_arima_predict(obj_00,inp_00,(double *)0x0,0,(double *)0x0,xpred_00,amse_00);
    printf("\n\n\n");
    printf("Forecast : 5 Point Look Ahead");
    printf("\n");
    printf("Predicted Values : ");
    for (d = 0; d < 0; d = d + 1) {
      printf("%g ",xpred_00[d]);
    }
    printf("\n");
    printf("Standard Errors  : ");
    for (d = 0; d < 0; d = d + 1) {
      dVar2 = sqrt(amse_00[d]);
      exp(dVar2);
      printf("%g ");
    }
    printf("\n");
    auto_arima_free(obj_00);
    free(inp_00);
    free(xpred_00);
    free(amse_00);
    fclose((FILE *)temp[0x4af]);
    return 0;
  }
  printf("Cannot Open File");
  exit(100);
}

Assistant:

int main(void) {
    int i, N, d, D, L;
	double *inp;
	int p, q, P, Q, s, r;
	double *xpred, *amse;
	auto_arima_object obj;
    /*
    Make sure all the parameter values are correct and consistent with other values. eg., if xreg is NULL r should be 0
    or if P = D = Q = 0 then make sure that s is also 0. 
     Recheck the values if the program fails to execute.
    */
	p = 5;
	d = 2;
	q = 5;
	s = 12;
	P = 2;
	D = 1;
	Q = 2;
	r = 0;
	int order[3] = {p,d,q};
	int seasonal[3] = {P,D,Q};


	L = 0;

	xpred = (double*)malloc(sizeof(double)* L);
	amse = (double*)malloc(sizeof(double)* L);

	FILE *ifp;
	double temp[1200];

	ifp = fopen("../data/seriesG.txt", "r");
	i = 0;
	if (!ifp) {
		printf("Cannot Open File");
		exit(100);
	}
	while (!feof(ifp)) {
		fscanf(ifp, "%lf\n", &temp[i]);
		i++;
	}
	N = i;

	inp = (double*)malloc(sizeof(double)* N);

	for (i = 0; i < N; ++i) {
		inp[i] = log(temp[i]);   
	}


	obj = auto_arima_init(order,seasonal,s,r,N);

	auto_arima_setApproximation(obj,1);
	auto_arima_setStepwise(obj,1);
	auto_arima_setVerbose(obj,1);

	auto_arima_exec(obj,inp,NULL);

	auto_arima_summary(obj);

	auto_arima_predict(obj, inp, NULL, L,NULL, xpred, amse);

	printf("\n\n\n");
	printf("Forecast : 5 Point Look Ahead");
	printf("\n");
	printf("Predicted Values : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", xpred[i]);
	}
	printf("\n");
	printf("Standard Errors  : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", exp(sqrt(amse[i])));
	}
	printf("\n");

	auto_arima_free(obj);

	
	free(inp);
	free(xpred);
	free(amse);
	fclose(ifp);

    return 0;
}